

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O0

double __thiscall ON_Localizer::Value(ON_Localizer *this,double t)

{
  double dVar1;
  double local_20;
  double s;
  double t_local;
  ON_Localizer *this_local;
  
  dVar1 = ON_Interval::NormalizedParameterAt(&this->m_d,t);
  if (0.0 < dVar1) {
    if (dVar1 < 1.0) {
      local_20 = dVar1 * dVar1 * (3.0 - (dVar1 + dVar1));
    }
    else {
      local_20 = 1.0;
    }
  }
  else {
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

double ON_Localizer::Value(double t) const
{
  double s = m_d.NormalizedParameterAt(t);
  if ( s <= 0.0 )
    s = 0.0;
  else if ( s >= 1.0 )
    s = 1.0;
  else
    s = s*s*(3.0 - 2.0*s);

  return s;
}